

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_api.cpp
# Opt level: O1

void __thiscall
cppcms::impl::cgi::connection::async_write_response
          (connection *this,response *response,bool complete_response,ehandler *h)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  int iVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder> tmp;
  error_code e;
  intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder> local_98;
  intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder> local_90;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> local_88;
  intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder> local_80;
  element_type *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  void *local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  error_code local_40;
  
  local_98.p_ = (async_write_binder *)0x0;
  peVar3 = (element_type *)(this->cached_async_write_binder_).p_;
  if (peVar3 != (element_type *)0x0) {
    (this->cached_async_write_binder_).p_ = (async_write_binder *)0x0;
    local_98.p_ = (async_write_binder *)peVar3;
  }
  if ((element_type *)local_98.p_ == (element_type *)0x0) {
    peVar3 = (element_type *)operator_new(0x30);
    (((callable<void_(const_std::error_code_&)> *)&peVar3->_vptr_connection)->super_refcounted).
    _vptr_refcounted = (_func_int **)0x0;
    (peVar3->super_enable_shared_from_this<cppcms::impl::cgi::connection>)._M_weak_this.
    super___weak_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (peVar3->pool_).pages_ = (page *)0x0;
    (peVar3->pool_).free_space_ = 0;
    (peVar3->super_enable_shared_from_this<cppcms::impl::cgi::connection>)._M_weak_this.
    super___weak_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (peVar3->pool_).page_size_ = 0;
    (((callable<void_(const_std::error_code_&)> *)&peVar3->_vptr_connection)->super_refcounted).
    _vptr_refcounted = (_func_int **)&PTR__refcounted_00287bd8;
    booster::atomic_counter::atomic_counter
              ((atomic_counter *)
               &peVar3->super_enable_shared_from_this<cppcms::impl::cgi::connection>,0);
    (((callable<void_(const_std::error_code_&)> *)&peVar3->_vptr_connection)->super_refcounted).
    _vptr_refcounted = (_func_int **)&PTR__async_write_binder_00287f68;
    (peVar3->super_enable_shared_from_this<cppcms::impl::cgi::connection>)._M_weak_this.
    super___weak_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (peVar3->pool_).page_size_ = 0;
    (peVar3->pool_).pages_ = (page *)0x0;
    local_78 = peVar3;
    booster::atomic_counter::inc();
    peVar3 = local_78;
    local_78 = (element_type *)local_98.p_;
    local_98.p_ = (async_write_binder *)peVar3;
    booster::intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder>::~intrusive_ptr
              ((intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder> *)&local_78);
  }
  std::__shared_ptr<cppcms::impl::cgi::connection,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cppcms::impl::cgi::connection,void>
            ((__shared_ptr<cppcms::impl::cgi::connection,(__gnu_cxx::_Lock_policy)2> *)&local_78,
             (__weak_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<cppcms::impl::cgi::connection>);
  p_Var1 = p_Stack_70;
  peVar3 = local_78;
  local_78 = (element_type *)0x0;
  p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = ((local_98.p_)->conn).
            super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  ((local_98.p_)->conn).
  super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
  ((local_98.p_)->conn).
  super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
  }
  if (&(local_98.p_)->h != h) {
    booster::intrusive_ptr<booster::callable<void_(cppcms::http::context::completion_type)>_>::
    operator=(&((local_98.p_)->h).call_ptr,&h->call_ptr);
  }
  (local_98.p_)->complete_response = complete_response;
  local_40._M_value = 0;
  local_40._M_cat = (error_category *)std::_V2::system_category();
  iVar2 = cppcms::http::response::flush_async_chunk(response,&local_40);
  if ((iVar2 == 0) &&
     ((this->pending_output_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->pending_output_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    local_78 = (element_type *)((ulong)local_78 & 0xffffffff00000000);
    local_60 = (void *)0x0;
    uStack_58 = 0;
    local_50 = 0;
    local_90.p_ = local_98.p_;
    if ((element_type *)local_98.p_ != (element_type *)0x0) {
      booster::atomic_counter::inc();
    }
    local_88.p_ = &(local_90.p_)->super_callable<void_(const_std::error_code_&)>;
    if ((element_type *)local_90.p_ != (element_type *)0x0) {
      booster::atomic_counter::inc();
    }
    (*this->_vptr_connection[5])(this,&local_78,0,&local_88);
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
              (&local_88);
    booster::intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder>::~intrusive_ptr
              (&local_90);
    if (local_60 != (void *)0x0) {
      operator_delete(local_60);
    }
  }
  else {
    iVar2 = (*this->_vptr_connection[0xc])(this);
    local_80.p_ = local_98.p_;
    if ((element_type *)local_98.p_ != (element_type *)0x0) {
      booster::atomic_counter::inc();
    }
    local_78 = (element_type *)local_80.p_;
    if ((element_type *)local_80.p_ != (element_type *)0x0) {
      booster::atomic_counter::inc();
    }
    booster::aio::io_service::post((callback *)CONCAT44(extraout_var,iVar2),(error_code *)&local_78)
    ;
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
              ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)&local_78);
    booster::intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder>::~intrusive_ptr
              (&local_80);
  }
  booster::intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder>::~intrusive_ptr
            (&local_98);
  return;
}

Assistant:

void connection::async_write_response(	http::response &response,
					bool complete_response,
					ehandler const &h)
{
	//  prepare cached binder
	booster::intrusive_ptr<connection::async_write_binder> tmp;
	if(cached_async_write_binder_) {
		tmp.swap(cached_async_write_binder_);
	}
	if(!tmp) {
		tmp = new connection::async_write_binder();
	}
	tmp->conn = self();
	tmp->h = h;
	tmp->complete_response = complete_response;
	// ready

	booster::system::error_code e;
	if(response.flush_async_chunk(e)!=0 || !has_pending()) {
		get_io_service().post(tmp,e);
		return;
	}
	async_write(booster::aio::const_buffer(),false,tmp);
}